

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O1

void PPC_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  char *pcVar1;
  int iVar2;
  
  if (*(int *)(ud + 0x60) == 3) {
    pcVar1 = strrchr(insn_asm,0x2b);
    if ((pcVar1 == (char *)0x0) || (pcVar1 = strstr(insn_asm,".+"), pcVar1 != (char *)0x0)) {
      pcVar1 = strrchr(insn_asm,0x2d);
      iVar2 = 2;
      if (pcVar1 == (char *)0x0) {
        return;
      }
    }
    else {
      iVar2 = 1;
    }
    (insn->detail->field_6).arm.vector_size = iVar2;
  }
  return;
}

Assistant:

void PPC_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)ud)->detail != CS_OPT_ON)
		return;

	// check if this insn has branch hint
	if (strrchr(insn_asm, '+') != NULL && !strstr(insn_asm, ".+")) {
		insn->detail->ppc.bh = PPC_BH_PLUS;
	} else if (strrchr(insn_asm, '-') != NULL) {
		insn->detail->ppc.bh = PPC_BH_MINUS;
	}
}